

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O2

exr_result_t generic_unpack(exr_decode_pipeline_t *decode)

{
  char cVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  exr_coding_channel_info_t *peVar5;
  uint8_t *puVar6;
  uint16_t uVar7;
  float fVar8;
  long lVar9;
  float *pfVar10;
  ulong uVar11;
  long lVar12;
  void *pvVar13;
  int iVar14;
  long lVar15;
  
  pvVar13 = decode->unpacked_buffer;
  uVar11 = 0;
  do {
    if ((long)(decode->chunk).height <= (long)uVar11) {
      return 0;
    }
    iVar2 = (decode->chunk).start_y;
    for (lVar12 = 0; lVar12 < decode->channel_count; lVar12 = lVar12 + 1) {
      peVar5 = decode->channels;
      puVar6 = peVar5[lVar12].field_12.decode_to_ptr;
      iVar3 = peVar5[lVar12].width;
      uVar4 = peVar5[lVar12].y_samples;
      cVar1 = peVar5[lVar12].bytes_per_element;
      lVar15 = (long)peVar5[lVar12].user_pixel_stride;
      if ((int)uVar4 < 2) {
        if (puVar6 != (uint8_t *)0x0) {
          lVar9 = (long)peVar5[lVar12].user_line_stride * uVar11;
          goto LAB_00121564;
        }
LAB_001215d7:
        pvVar13 = (void *)((long)pvVar13 + (long)(iVar3 * cVar1));
      }
      else if ((iVar2 + (int)uVar11) % (int)uVar4 == 0) {
        if (puVar6 == (uint8_t *)0x0) goto LAB_001215d7;
        lVar9 = (long)peVar5[lVar12].user_line_stride * ((uVar11 & 0xffffffff) / (ulong)uVar4);
LAB_00121564:
        pfVar10 = (float *)(puVar6 + lVar9);
        uVar7 = peVar5[lVar12].data_type;
        if (uVar7 == 0) {
          uVar7 = peVar5[lVar12].user_data_type;
          if (uVar7 == 2) {
            iVar14 = 0;
            if (0 < iVar3) {
              iVar14 = iVar3;
            }
            for (lVar9 = 0; iVar14 != (int)lVar9; lVar9 = lVar9 + 1) {
              *pfVar10 = (float)*(uint *)((long)pvVar13 + lVar9 * 4);
              pfVar10 = (float *)((long)pfVar10 + lVar15);
            }
          }
          else if (uVar7 == 1) {
            iVar14 = 0;
            if (0 < iVar3) {
              iVar14 = iVar3;
            }
            for (lVar9 = 0; iVar14 != (int)lVar9; lVar9 = lVar9 + 1) {
              uVar7 = uint_to_half(*(uint32_t *)((long)pvVar13 + lVar9 * 4));
              *(uint16_t *)pfVar10 = uVar7;
              pfVar10 = (float *)((long)pfVar10 + lVar15);
            }
          }
          else {
            if (uVar7 != 0) {
              return 3;
            }
            iVar14 = 0;
            if (0 < iVar3) {
              iVar14 = iVar3;
            }
            for (lVar9 = 0; iVar14 != (int)lVar9; lVar9 = lVar9 + 1) {
              *pfVar10 = *(float *)((long)pvVar13 + lVar9 * 4);
              pfVar10 = (float *)((long)pfVar10 + lVar15);
            }
          }
        }
        else if (uVar7 == 2) {
          uVar7 = peVar5[lVar12].user_data_type;
          if (uVar7 == 2) {
            iVar14 = 0;
            if (0 < iVar3) {
              iVar14 = iVar3;
            }
            for (lVar9 = 0; iVar14 != (int)lVar9; lVar9 = lVar9 + 1) {
              *pfVar10 = *(float *)((long)pvVar13 + lVar9 * 4);
              pfVar10 = (float *)((long)pfVar10 + lVar15);
            }
          }
          else if (uVar7 == 1) {
            iVar14 = 0;
            if (0 < iVar3) {
              iVar14 = iVar3;
            }
            for (lVar9 = 0; iVar14 != (int)lVar9; lVar9 = lVar9 + 1) {
              uVar7 = float_to_half(*(float *)((long)pvVar13 + lVar9 * 4));
              *(uint16_t *)pfVar10 = uVar7;
              pfVar10 = (float *)((long)pfVar10 + lVar15);
            }
          }
          else {
            if (uVar7 != 0) {
              return 3;
            }
            iVar14 = 0;
            if (0 < iVar3) {
              iVar14 = iVar3;
            }
            for (lVar9 = 0; iVar14 != (int)lVar9; lVar9 = lVar9 + 1) {
              fVar8 = (float)float_to_uint_int(*(uint32_t *)((long)pvVar13 + lVar9 * 4));
              *pfVar10 = fVar8;
              pfVar10 = (float *)((long)pfVar10 + lVar15);
            }
          }
        }
        else {
          if (uVar7 != 1) {
            return 3;
          }
          uVar7 = peVar5[lVar12].user_data_type;
          if (uVar7 == 2) {
            iVar14 = 0;
            if (0 < iVar3) {
              iVar14 = iVar3;
            }
            for (lVar9 = 0; iVar14 != (int)lVar9; lVar9 = lVar9 + 1) {
              fVar8 = half_to_float(*(uint16_t *)((long)pvVar13 + lVar9 * 2));
              *pfVar10 = fVar8;
              pfVar10 = (float *)((long)pfVar10 + lVar15);
            }
          }
          else if (uVar7 == 1) {
            iVar14 = 0;
            if (0 < iVar3) {
              iVar14 = iVar3;
            }
            for (lVar9 = 0; iVar14 != (int)lVar9; lVar9 = lVar9 + 1) {
              *(uint16_t *)pfVar10 = *(uint16_t *)((long)pvVar13 + lVar9 * 2);
              pfVar10 = (float *)((long)pfVar10 + lVar15);
            }
          }
          else {
            if (uVar7 != 0) {
              return 3;
            }
            iVar14 = 0;
            if (0 < iVar3) {
              iVar14 = iVar3;
            }
            for (lVar9 = 0; iVar14 != (int)lVar9; lVar9 = lVar9 + 1) {
              fVar8 = (float)half_to_uint(*(uint16_t *)((long)pvVar13 + lVar9 * 2));
              *pfVar10 = fVar8;
              pfVar10 = (float *)((long)pfVar10 + lVar15);
            }
          }
        }
        pvVar13 = (void *)((long)pvVar13 + (long)(iVar3 * cVar1));
      }
    }
    uVar11 = uVar11 + 1;
  } while( true );
}

Assistant:

static exr_result_t
generic_unpack (exr_decode_pipeline_t* decode)
{
    const uint8_t* srcbuffer = (const uint8_t*) decode->unpacked_buffer;
    uint8_t*       cdata;
    int            w, bpc, ubpc;

    for (int y = 0; y < decode->chunk.height; ++y)
    {
        int cury = y + decode->chunk.start_y;

        for (int c = 0; c < decode->channel_count; ++c)
        {
            exr_coding_channel_info_t* decc = (decode->channels + c);

            cdata = decc->decode_to_ptr;
            w     = decc->width;
            bpc   = decc->bytes_per_element;
            ubpc  = decc->user_pixel_stride;

            if (decc->y_samples > 1)
            {
                if ((cury % decc->y_samples) != 0) continue;
                if (cdata)
                    cdata +=
                        ((uint64_t) (y / decc->y_samples) *
                         (uint64_t) decc->user_line_stride);
                else
                {
                    srcbuffer += w * bpc;
                    continue;
                }
            }
            else if (cdata)
            {
                cdata += ((uint64_t) y) * ((uint64_t) decc->user_line_stride);
            }
            else
            {
                srcbuffer += w * bpc;
                continue;
            }

            UNPACK_SAMPLES (w)
            srcbuffer += w * bpc;
        }
    }
    return EXR_ERR_SUCCESS;
}